

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutputTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_TestOutput_SetProgressIndicator_TestShell::createTest
          (TEST_TestOutput_SetProgressIndicator_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x40,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestOutputTest.cpp"
                                  ,0x99);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  this_00[5]._vptr_Utest = (_func_int **)0x0;
  this_00[6]._vptr_Utest = (_func_int **)0x0;
  this_00[7]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_00372920;
  return this_00;
}

Assistant:

TEST(TestOutput, SetProgressIndicator)
{
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator("!");
    printer->printCurrentTestEnded(*result);
    printer->setProgressIndicator(".");
    printer->printCurrentTestEnded(*result);

    STRCMP_EQUAL(".!.", mock->getOutput().asCharString());
}